

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

void __thiscall Kernel::InferenceStore::TPTPProofPrinter::printStep(TPTPProofPrinter *this,Unit *us)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InferenceRule rule;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  Formula *pFVar8;
  ostream *poVar9;
  Unit *pUVar10;
  ulong *puVar11;
  size_type *psVar12;
  SplitSet **ppSVar13;
  SplitSet *pSVar14;
  undefined8 uVar15;
  string newSymbOrigin;
  string statusStr;
  UnitIterator parents;
  string inferenceStr;
  string formulaStr;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  undefined8 uStack_1b0;
  Unit *local_1a8;
  long *local_1a0;
  SplitSet **local_198;
  long local_190;
  SplitSet *local_188;
  void *pvStack_180;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  string local_158;
  string local_138;
  ulong local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  rule = (us->_inference).field_0x1;
  Unit::getParents((Unit *)&local_1a0);
  if (rule == GENERAL_SPLITTING) {
    printSplitting(this,us);
    goto LAB_005417ab;
  }
  if (rule == GENERAL_SPLITTING_COMPONENT) {
    printGeneralSplittingComponent(this,us);
    goto LAB_005417ab;
  }
  getFormulaString_abi_cxx11_(&local_70,this,us);
  local_178 = &local_168;
  local_170 = 0;
  local_168 = 0;
  local_118 = (ulong)rule;
  local_1a8 = us;
  if (rule == INPUT) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,*(long *)(::Lib::env + 0xdf50),
               *(long *)(::Lib::env + 0xdf58) + *(long *)(::Lib::env + 0xdf50));
    iVar5 = std::__cxx11::string::compare((char *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1e8,0,(char *)local_1e8._M_string_length,0x87115e);
    }
    else {
      local_1c8 = &local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,*(long *)(::Lib::env + 0xdf50),
                 *(long *)(::Lib::env + 0xdf58) + *(long *)(::Lib::env + 0xdf50));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x91a599);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208.field_2._8_8_ = plVar6[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_208._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228.field_2._8_8_ = plVar6[3];
        local_228._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_228._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      us = local_1a8;
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
    }
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity =
         local_228.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    if (((this->super_ProofPrinter).outputAxiomNames != true) ||
       (bVar4 = Parse::TPTP::findAxiomName(us,&local_228), !bVar4)) {
      if ((us->field_0x4 & 1) != 0) {
        pFVar8 = Unit::getFormula(us);
        bVar4 = Formula::hasLabel(pFVar8);
        if (bVar4) {
          pFVar8 = Unit::getFormula(us);
          pcVar2 = (pFVar8->_label)._M_dataplus._M_p;
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,pcVar2,pcVar2 + (pFVar8->_label)._M_string_length);
          std::__cxx11::string::operator=((string *)&local_228,(string *)&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0054131e;
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_228,0,(char *)local_228._M_string_length,0x87115e);
    }
LAB_0054131e:
    std::operator+(&local_158,"file(",&local_1e8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    ppSVar13 = (SplitSet **)(plVar6 + 2);
    if ((SplitSet **)*plVar6 == ppSVar13) {
      local_188 = *ppSVar13;
      pvStack_180 = (void *)plVar6[3];
      local_198 = &local_188;
    }
    else {
      local_188 = *ppSVar13;
      local_198 = (SplitSet **)*plVar6;
    }
    local_190 = plVar6[1];
    *plVar6 = (long)ppSVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_228._M_dataplus._M_p,
               (char *)(local_228._M_string_length + (long)local_228._M_dataplus._M_p));
    quoteAxiomName(&local_138,this,&local_90);
    pSVar14 = (SplitSet *)0xf;
    if (local_198 != &local_188) {
      pSVar14 = local_188;
    }
    if (pSVar14 < (SplitSet *)(local_138._M_string_length + local_190)) {
      uVar15 = (SplitSet *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar15 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (SplitSet *)(local_138._M_string_length + local_190)) goto LAB_0054142e;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_198);
    }
    else {
LAB_0054142e:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_138._M_dataplus._M_p)
      ;
    }
    local_1c8 = &local_1b8;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_1b8 = *plVar6;
      uStack_1b0 = puVar7[3];
    }
    else {
      local_1b8 = *plVar6;
      local_1c8 = (long *)*puVar7;
    }
    local_1c0 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_208.field_2._M_allocated_capacity = *psVar12;
      local_208.field_2._8_8_ = plVar6[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar12;
      local_208._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_208._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pUVar10 = local_1a8;
    if (local_198 != &local_188) {
      operator_delete(local_198,(ulong)((long)&local_188->_size + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    local_158.field_2._M_allocated_capacity = local_228.field_2._M_allocated_capacity;
    local_158._M_dataplus._M_p = local_228._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
LAB_005415e6:
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
LAB_005415ee:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_005415fd:
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    cVar3 = (**(code **)(*local_1a0 + 0x10))();
    if (cVar3 == '\0') {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      bVar4 = hasNewSymbols(this,us);
      if (bVar4) {
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity =
             local_228.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        if ((rule - 0x7d < 4) || (rule == FUNCTION_DEFINITION)) {
          std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,0x9182f1);
        }
        else {
          std::__cxx11::string::operator=((string *)&local_228,"naming");
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_228._M_dataplus._M_p,
                   (char *)(local_228._M_string_length + (long)local_228._M_dataplus._M_p));
        getNewSymbols(&local_208,this,&local_b0,us);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
      }
      tptpRuleName_abi_cxx11_(&local_158,this,rule);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x919a98);
      ppSVar13 = (SplitSet **)(plVar6 + 2);
      if ((SplitSet **)*plVar6 == ppSVar13) {
        local_188 = *ppSVar13;
        pvStack_180 = (void *)plVar6[3];
        local_198 = &local_188;
      }
      else {
        local_188 = *ppSVar13;
        local_198 = (SplitSet **)*plVar6;
      }
      local_190 = plVar6[1];
      *plVar6 = (long)ppSVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_1b8 = *plVar6;
        uStack_1b0 = puVar7[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar6;
        local_1c8 = (long *)*puVar7;
      }
      local_1c0 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c8,(ulong)local_1e8._M_dataplus._M_p);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208.field_2._8_8_ = plVar6[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar12;
        local_208._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_208._M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228.field_2._8_8_ = plVar6[3];
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_228._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,local_1b8 + 1);
      }
      pUVar10 = local_1a8;
      if (local_198 != &local_188) {
        operator_delete(local_198,(ulong)((long)&local_188->_size + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_005415e6;
      goto LAB_005415ee;
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    if (rule == SKOLEMIZE) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"skolem","");
      getNewSymbols(&local_208,this,&local_d0,us);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x919aa7);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228.field_2._8_8_ = plVar6[3];
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar11;
        local_228._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_228._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    tptpRuleName_abi_cxx11_(&local_208,this,rule);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x919abb);
    paVar1 = &local_228.field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_228.field_2._M_allocated_capacity = *psVar12;
      local_228.field_2._8_8_ = plVar6[3];
      local_228._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar12;
      local_228._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_228._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_208,",[",&local_1e8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_228.field_2._M_allocated_capacity = *puVar11;
      local_228.field_2._8_8_ = plVar6[3];
      local_228._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar11;
      local_228._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_228._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    bVar4 = true;
    while (cVar3 = (**(code **)(*local_1a0 + 0x10))(), cVar3 != '\0') {
      pUVar10 = (Unit *)(**(code **)(*local_1a0 + 0x18))();
      if (!bVar4) {
        std::__cxx11::string::push_back((char)&local_178);
      }
      tptpUnitId_abi_cxx11_(&local_228,this,pUVar10);
      std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_228._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
    }
    std::__cxx11::string::append((char *)&local_178);
    pUVar10 = local_1a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_005415fd;
  }
  poVar9 = (this->super_ProofPrinter).out;
  tptpUnitId_abi_cxx11_(&local_50,this,pUVar10);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_178,local_178 + local_170);
  getFofString(&local_1e8,this,&local_50,&local_f0,&local_110,(InferenceRule)local_118,
               *(byte *)&local_1a8->_inference >> 2 & (MODEL_DEFINITION|ASSUMPTION));
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_005417ab:
  if (local_1a0 != (long *)0x0) {
    plVar6 = local_1a0 + 1;
    *(int *)plVar6 = (int)*plVar6 + -1;
    if ((int)*plVar6 == 0) {
      (**(code **)(*local_1a0 + 8))();
    }
  }
  return;
}

Assistant:

void printStep(Unit* us)
  {
    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();

    switch(rule) {
    //case Inference::AVATAR_COMPONENT:
    //  printSplittingComponentIntroduction(us);
    //  return;
    case InferenceRule::GENERAL_SPLITTING_COMPONENT:
      printGeneralSplittingComponent(us);
      return;
    case InferenceRule::GENERAL_SPLITTING:
      printSplitting(us);
      return;
    default: ;
    }

    //get std::string representing the formula

    std::string formulaStr=getFormulaString(us);

    //get inference std::string

    std::string inferenceStr;
    if (rule==InferenceRule::INPUT) {
      std::string fileName;
      if (env.options->inputFile()=="") {
	      fileName="unknown";
      }
      else {
	      fileName="'"+env.options->inputFile()+"'";
      }
      std::string axiomName;
      if (!outputAxiomNames || !Parse::TPTP::findAxiomName(us, axiomName)) {
        // Giles' ucore extraction code parses labels from smtlib files, let's try printing these too
        if (!us->isClause() && us->getFormula()->hasLabel()) {
          axiomName = us->getFormula()->getLabel();
        } else {
	        axiomName="unknown";
        }
      }
      inferenceStr="file("+fileName+","+quoteAxiomName(axiomName)+")";
    }
    else if (!parents.hasNext()) {
      std::string newSymbolInfo;
      if (hasNewSymbols(us)) {
        std::string newSymbOrigin;
        if (rule == InferenceRule::FUNCTION_DEFINITION ||
          rule == InferenceRule::FOOL_ITE_DEFINITION || rule == InferenceRule::FOOL_LET_DEFINITION ||
          rule == InferenceRule::FOOL_FORMULA_DEFINITION || rule == InferenceRule::FOOL_MATCH_DEFINITION) {
          newSymbOrigin = "definition";
        } else {
          newSymbOrigin = "naming";
        }
	      newSymbolInfo = getNewSymbols(newSymbOrigin,us);
      }
      inferenceStr="introduced("+tptpRuleName(rule)+",["+newSymbolInfo+"])";
    }
    else {
      ASS(parents.hasNext());
      std::string statusStr;
      if (rule==InferenceRule::SKOLEMIZE) {
	      statusStr="status(esa),"+getNewSymbols("skolem",us);
      }

      inferenceStr="inference("+tptpRuleName(rule);

      inferenceStr+=",["+statusStr+"],[";
      bool first=true;
      while(parents.hasNext()) {
        Unit* prem=parents.next();
        if (!first) {
          inferenceStr+=',';
        }
        inferenceStr+=tptpUnitId(prem);
        first=false;
      }
      inferenceStr+="])";
    }

    out<<getFofString(tptpUnitId(us), formulaStr, inferenceStr, rule, us->inputType())<<endl;
  }